

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerializedPipelineStateImpl.cpp
# Opt level: O2

void __thiscall
Diligent::SerializedShaderStageInfo::Append
          (SerializedShaderStageInfo *this,SerializedShaderImpl *pShader)

{
  SHADER_TYPE ShaderType;
  ShaderCreateInfoWrapper *pSVar1;
  __normal_iterator<const_Diligent::SerializedShaderImpl_**,_std::vector<const_Diligent::SerializedShaderImpl_*,_std::allocator<const_Diligent::SerializedShaderImpl_*>_>_>
  _Var2;
  char (*in_RCX) [19];
  char (*in_R8) [61];
  char (*in_stack_ffffffffffffff98) [3];
  SerializedShaderImpl *pShader_local;
  string msg;
  Char *local_38;
  Char *local_30;
  
  pShader_local = pShader;
  if (pShader == (SerializedShaderImpl *)0x0) {
    FormatString<char[26],char[19]>
              (&msg,(Diligent *)"Debug expression failed:\n",(char (*) [26])"pShader != nullptr",
               in_RCX);
    in_RCX = (char (*) [19])0x13d;
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"Append",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/SerializedPipelineStateImpl.cpp"
               ,0x13d);
    std::__cxx11::string::~string((string *)&msg);
  }
  _Var2 = std::
          __find_if<__gnu_cxx::__normal_iterator<Diligent::SerializedShaderImpl_const**,std::vector<Diligent::SerializedShaderImpl_const*,std::allocator<Diligent::SerializedShaderImpl_const*>>>,__gnu_cxx::__ops::_Iter_equals_val<Diligent::SerializedShaderImpl_const*const>>
                    ((this->Shaders).
                     super__Vector_base<const_Diligent::SerializedShaderImpl_*,_std::allocator<const_Diligent::SerializedShaderImpl_*>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (this->Shaders).
                     super__Vector_base<const_Diligent::SerializedShaderImpl_*,_std::allocator<const_Diligent::SerializedShaderImpl_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish,&pShader_local);
  if (_Var2._M_current !=
      (this->Shaders).
      super__Vector_base<const_Diligent::SerializedShaderImpl_*,_std::allocator<const_Diligent::SerializedShaderImpl_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    FormatString<char[9],char_const*,char[61]>
              (&msg,(Diligent *)"Shader \'",
               (char (*) [9])&(pShader_local->m_CreateInfo).m_CreateInfo.Desc,
               (char **)"\' already exists in the stage. Shaders must be deduplicated.",in_R8);
    in_RCX = (char (*) [19])0x13f;
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"Append",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/SerializedPipelineStateImpl.cpp"
               ,0x13f);
    std::__cxx11::string::~string((string *)&msg);
  }
  ShaderType = (pShader_local->m_CreateInfo).m_CreateInfo.Desc.ShaderType;
  if (this->Type == SHADER_TYPE_UNKNOWN) {
    if ((this->Shaders).
        super__Vector_base<const_Diligent::SerializedShaderImpl_*,_std::allocator<const_Diligent::SerializedShaderImpl_*>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (this->Shaders).
        super__Vector_base<const_Diligent::SerializedShaderImpl_*,_std::allocator<const_Diligent::SerializedShaderImpl_*>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      FormatString<char[26],char[16]>
                (&msg,(Diligent *)"Debug expression failed:\n",(char (*) [26])"Shaders.empty()",
                 (char (*) [16])in_RCX);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"Append",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/SerializedPipelineStateImpl.cpp"
                 ,0x144);
      std::__cxx11::string::~string((string *)&msg);
    }
    this->Type = ShaderType;
  }
  else if (this->Type != ShaderType) {
    local_30 = GetShaderTypeLiteralName(ShaderType);
    pSVar1 = &pShader_local->m_CreateInfo;
    local_38 = GetShaderTypeLiteralName(this->Type);
    FormatString<char[11],char_const*,char[14],char_const*,char[65],char_const*,char[3]>
              (&msg,(Diligent *)"The type (",(char (*) [11])&local_30,(char **)") of shader \'",
               (char (*) [14])&(pSVar1->m_CreateInfo).Desc,
               (char **)"\' being added to the stage is inconsistent with the stage type (",
               (char (*) [65])&local_38,(char **)0x8019c0,in_stack_ffffffffffffff98);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"Append",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/SerializedPipelineStateImpl.cpp"
               ,0x14b);
    std::__cxx11::string::~string((string *)&msg);
  }
  std::
  vector<const_Diligent::SerializedShaderImpl_*,_std::allocator<const_Diligent::SerializedShaderImpl_*>_>
  ::push_back(&this->Shaders,&pShader_local);
  return;
}

Assistant:

void Append(const SerializedShaderImpl* pShader)
    {
        VERIFY_EXPR(pShader != nullptr);
        VERIFY(std::find(Shaders.begin(), Shaders.end(), pShader) == Shaders.end(),
               "Shader '", pShader->GetDesc().Name, "' already exists in the stage. Shaders must be deduplicated.");

        const SHADER_TYPE NewShaderType = pShader->GetDesc().ShaderType;
        if (Type == SHADER_TYPE_UNKNOWN)
        {
            VERIFY_EXPR(Shaders.empty());
            Type = NewShaderType;
        }
        else
        {
            VERIFY(Type == NewShaderType, "The type (", GetShaderTypeLiteralName(NewShaderType),
                   ") of shader '", pShader->GetDesc().Name, "' being added to the stage is inconsistent with the stage type (",
                   GetShaderTypeLiteralName(Type), ").");
        }
        Shaders.push_back(pShader);
    }